

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_iCCP(png_structrp png_ptr,png_const_charp name,png_const_bytep profile)

{
  uint uVar1;
  png_uint_32 pVar2;
  uint prefix_len;
  int iVar3;
  png_uint_32 embedded_profile_len;
  png_uint_32 temp;
  compression_state comp;
  png_byte new_name [81];
  png_uint_32 profile_len;
  png_uint_32 name_len;
  png_const_bytep profile_local;
  png_const_charp name_local;
  png_structrp png_ptr_local;
  
  if (profile == (png_const_bytep)0x0) {
    png_error(png_ptr,"No profile for iCCP chunk");
  }
  uVar1 = (uint)*profile * 0x1000000 + (uint)profile[1] * 0x10000 + (uint)profile[2] * 0x100 +
          (uint)profile[3];
  if (uVar1 < 0x84) {
    png_error(png_ptr,"ICC profile too short");
  }
  if ((3 < profile[8]) && ((uVar1 & 3) != 0)) {
    png_error(png_ptr,"ICC profile length invalid (not a multiple of 4)");
  }
  if (uVar1 != (uint)*profile * 0x1000000 + (uint)profile[1] * 0x10000 + (uint)profile[2] * 0x100 +
               (uint)profile[3]) {
    png_error(png_ptr,"Profile length does not match profile");
  }
  pVar2 = png_check_keyword(png_ptr,name,comp.output + 0x3fc);
  if (pVar2 == 0) {
    png_error(png_ptr,"iCCP: invalid keyword");
  }
  new_name[(ulong)(pVar2 + 1) - 8] = '\0';
  prefix_len = pVar2 + 2;
  png_text_compress_init((compression_state *)&embedded_profile_len,profile,(ulong)uVar1);
  iVar3 = png_text_compress(png_ptr,0x69434350,(compression_state *)&embedded_profile_len,prefix_len
                           );
  if (iVar3 != 0) {
    png_error(png_ptr,(png_ptr->zstream).msg);
  }
  png_write_chunk_header(png_ptr,0x69434350,prefix_len + (int)comp.input_len);
  png_write_chunk_data(png_ptr,comp.output + 0x3fc,(ulong)prefix_len);
  png_write_compressed_data_out(png_ptr,(compression_state *)&embedded_profile_len);
  png_write_chunk_end(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_write_iCCP(png_structrp png_ptr, png_const_charp name,
    png_const_bytep profile)
{
   png_uint_32 name_len;
   png_uint_32 profile_len;
   png_byte new_name[81]; /* 1 byte for the compression byte */
   compression_state comp;
   png_uint_32 temp;

   png_debug(1, "in png_write_iCCP");

   /* These are all internal problems: the profile should have been checked
    * before when it was stored.
    */
   if (profile == NULL)
      png_error(png_ptr, "No profile for iCCP chunk"); /* internal error */

   profile_len = png_get_uint_32(profile);

   if (profile_len < 132)
      png_error(png_ptr, "ICC profile too short");

   temp = (png_uint_32) (*(profile+8));
   if (temp > 3 && (profile_len & 0x03))
      png_error(png_ptr, "ICC profile length invalid (not a multiple of 4)");

   {
      png_uint_32 embedded_profile_len = png_get_uint_32(profile);

      if (profile_len != embedded_profile_len)
         png_error(png_ptr, "Profile length does not match profile");
   }

   name_len = png_check_keyword(png_ptr, name, new_name);

   if (name_len == 0)
      png_error(png_ptr, "iCCP: invalid keyword");

   new_name[++name_len] = PNG_COMPRESSION_TYPE_BASE;

   /* Make sure we include the NULL after the name and the compression type */
   ++name_len;

   png_text_compress_init(&comp, profile, profile_len);

   /* Allow for keyword terminator and compression byte */
   if (png_text_compress(png_ptr, png_iCCP, &comp, name_len) != Z_OK)
      png_error(png_ptr, png_ptr->zstream.msg);

   png_write_chunk_header(png_ptr, png_iCCP, name_len + comp.output_len);

   png_write_chunk_data(png_ptr, new_name, name_len);

   png_write_compressed_data_out(png_ptr, &comp);

   png_write_chunk_end(png_ptr);
}